

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

void __thiscall
Js::CustomExternalWrapperType::CustomExternalWrapperType
          (CustomExternalWrapperType *this,ScriptContext *scriptContext,
          JsTraceCallback traceCallback,JsFinalizeCallback finalizeCallback,
          RecyclableObject *prototype)

{
  JavascriptLibrary *this_00;
  TypePath *typePath;
  DynamicTypeHandler *typeHandler;
  Recycler *pRVar1;
  _JsGetterSetterInterceptor *this_01;
  TrackAllocData local_58;
  RecyclableObject *local_30;
  RecyclableObject *prototype_local;
  JsFinalizeCallback finalizeCallback_local;
  JsTraceCallback traceCallback_local;
  ScriptContext *scriptContext_local;
  CustomExternalWrapperType *this_local;
  
  local_30 = prototype;
  prototype_local = (RecyclableObject *)finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local = (JsTraceCallback)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  this_00 = ScriptContext::GetLibrary(scriptContext);
  typePath = JavascriptLibrary::GetRootPath(this_00);
  typeHandler = (DynamicTypeHandler *)
                PathTypeHandlerNoAttr::New
                          (scriptContext,typePath,0,0,0,true,true,(DynamicType *)0x0);
  DynamicType::DynamicType
            (&this->super_DynamicType,scriptContext,TypeIds_Object,prototype,(JavascriptMethod)0x0,
             typeHandler,true,true);
  this->jsTraceCallback = finalizeCallback_local;
  this->jsFinalizeCallback = (Type)prototype_local;
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)traceCallback_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&_JsGetterSetterInterceptor::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
             ,0x19);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  this_01 = (_JsGetterSetterInterceptor *)new<Memory::Recycler>(0x48,pRVar1,0x744a10);
  _JsGetterSetterInterceptor::_JsGetterSetterInterceptor(this_01);
  this->jsGetterSetterInterceptor = this_01;
  ::operator|=(&(this->super_DynamicType).super_Type.flags,TypeFlagMask_JsrtExternal);
  return;
}

Assistant:

CustomExternalWrapperType::CustomExternalWrapperType(Js::ScriptContext* scriptContext, JsTraceCallback traceCallback, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype)
    : Js::DynamicType(
        scriptContext,
        Js::TypeIds_Object,
        prototype,
        nullptr,
        Js::PathTypeHandlerNoAttr::New(scriptContext, scriptContext->GetLibrary()->GetRootPath(), 0, 0, 0, true, true),
        true,
        true)
    , jsTraceCallback(traceCallback)
    , jsFinalizeCallback(finalizeCallback)
{
    this->jsGetterSetterInterceptor = RecyclerNewStructZ(scriptContext->GetRecycler(), JsGetterSetterInterceptor);
    this->flags |= TypeFlagMask_JsrtExternal;
}